

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameBase.cpp
# Opt level: O0

void __thiscall BayesianGameBase::ChangeNrActions(BayesianGameBase *this,Index agI,size_t new_nr)

{
  reference pvVar1;
  size_type in_RDX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  BayesianGameBase *in_stack_000000b0;
  
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at(in_RDI,in_RDX);
  *pvVar1 = in_RDX;
  Initialize(in_stack_000000b0);
  return;
}

Assistant:

void BayesianGameBase::ChangeNrActions(Index agI, size_t new_nr)
{
    _m_nrActions.at(agI) = new_nr;
    Initialize();
}